

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMulti.c
# Opt level: O0

void Abc_NtkMultiSetBoundsSimple(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int local_1c;
  int i;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pNtk_local;
  
  local_1c = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(pNtk->vObjs);
    if (iVar1 <= local_1c) {
      for (local_1c = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_1c < iVar1; local_1c = local_1c + 1
          ) {
        pAVar2 = Abc_NtkObj(pNtk,local_1c);
        if ((pAVar2 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar2), iVar1 != 0)) {
          *(uint *)&pAVar2->field_0x14 = *(uint *)&pAVar2->field_0x14 & 0xffffffef | 0x10;
        }
      }
      return;
    }
    pAVar2 = Abc_NtkObj(pNtk,local_1c);
    if ((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 >> 4 & 1) != 0)) break;
    local_1c = local_1c + 1;
  }
  __assert_fail("pNode->fMarkA == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMulti.c"
                ,0x23d,"void Abc_NtkMultiSetBoundsSimple(Abc_Ntk_t *)");
}

Assistant:

void Abc_NtkMultiSetBoundsSimple( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int i;
    // make sure the mark is not set
    Abc_NtkForEachObj( pNtk, pNode, i )
        assert( pNode->fMarkA == 0 );
    // mark the nodes where expansion stops using pNode->fMarkA
    Abc_NtkForEachNode( pNtk, pNode, i )
        pNode->fMarkA = 1;
}